

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::(anonymous_namespace)::getCurrentTimestamp_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator local_51;
  char *local_50;
  char *fmt;
  char timeStamp [21];
  tm *timeInfo;
  unsigned_long timeStampSize;
  time_t rawtime;
  
  time((time_t *)&timeStampSize);
  __tp = gmtime((time_t *)&timeStampSize);
  local_50 = "%Y-%m-%dT%H:%M:%SZ";
  strftime((char *)&fmt,0x15,"%Y-%m-%dT%H:%M:%SZ",__tp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)&fmt,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

std::string getCurrentTimestamp() {
            // Beware, this is not reentrant because of backward compatibility issues
            // Also, UTC only, again because of backward compatibility (%z is C++11)
            time_t rawtime;
            std::time(&rawtime);
            auto const timeStampSize = sizeof("2017-01-16T17:06:45Z");

#ifdef _MSC_VER
            std::tm timeInfo = {};
            gmtime_s(&timeInfo, &rawtime);
#else
            std::tm* timeInfo;
            timeInfo = std::gmtime(&rawtime);
#endif

            char timeStamp[timeStampSize];
            const char * const fmt = "%Y-%m-%dT%H:%M:%SZ";

#ifdef _MSC_VER
            std::strftime(timeStamp, timeStampSize, fmt, &timeInfo);
#else
            std::strftime(timeStamp, timeStampSize, fmt, timeInfo);
#endif
            return std::string(timeStamp);
        }